

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_Constructor_type_prefix_Test::TestBody
          (AddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  WitnessVersion WVar5;
  char *pcVar6;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AddressFactory factory_7;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AddressFactory factory_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Address address_2;
  AddressFactory factory_5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Address address_1;
  AddressFactory factory_4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  AddressFactory factory_3;
  Pubkey pubkey;
  AddressFactory factory_2;
  AddressFactory factory_1;
  AddressFactory factory;
  undefined4 in_stack_fffffffffffff460;
  undefined1 in_stack_fffffffffffff464;
  undefined1 in_stack_fffffffffffff465;
  undefined1 in_stack_fffffffffffff466;
  undefined1 in_stack_fffffffffffff467;
  NetType *in_stack_fffffffffffff468;
  undefined4 in_stack_fffffffffffff470;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff474;
  char *in_stack_fffffffffffff478;
  AssertHelper local_b28;
  Message local_b20 [2];
  Pubkey local_b10 [15];
  byte local_991;
  ConstCharPtr local_990;
  vector local_988 [24];
  AddressFactory local_970;
  AssertHelper local_948;
  Message local_940 [2];
  Pubkey local_930 [15];
  byte local_7b1;
  ConstCharPtr local_7b0;
  vector local_7a8 [24];
  AddressFactory local_790;
  AssertHelper local_768;
  Message local_760;
  undefined4 local_758;
  WitnessVersion local_754;
  AssertionResult local_750;
  AssertHelper local_740;
  Message local_738;
  undefined4 local_730;
  NetType local_72c;
  AssertionResult local_728;
  Pubkey local_718 [15];
  vector local_5a0 [24];
  AddressFactory local_588;
  AssertHelper local_560;
  Message local_558;
  undefined4 local_550;
  WitnessVersion local_54c;
  AssertionResult local_548;
  AssertHelper local_538;
  Message local_530;
  undefined4 local_528;
  NetType local_524;
  AssertionResult local_520;
  Pubkey local_510 [15];
  vector local_398 [24];
  AddressFactory local_380;
  AssertHelper local_358;
  Message local_350;
  undefined4 local_348;
  WitnessVersion local_344;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_320;
  NetType local_31c;
  AssertionResult local_318;
  Pubkey local_308 [15];
  vector local_190 [24];
  AddressFactory local_178;
  allocator local_149;
  string local_148 [32];
  Pubkey local_128;
  AssertHelper local_110;
  Message local_108;
  vector local_100 [24];
  AddressFactory local_e8;
  AssertHelper local_c0;
  Message local_b8;
  vector local_b0 [24];
  AddressFactory local_98;
  AssertHelper local_70;
  Message local_68 [2];
  vector local_58 [24];
  AddressFactory local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&local_40,kMainnet,local_58);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x184517);
    }
  }
  else {
    testing::Message::Message(local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa7,
               "Expected: AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message((Message *)0x1845dd);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&local_98,kTestnet,local_b0);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x184693);
    }
  }
  else {
    testing::Message::Message(&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa8,
               "Expected: AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x184759);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory(&local_e8,kRegtest,local_100);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18480f);
    }
  }
  else {
    testing::Message::Message(&local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa9,
               "Expected: AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x1848d5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             &local_149);
  cfd::core::Pubkey::Pubkey(&local_128,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_178,kMainnet,local_190);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  cfd::AddressFactory::CreateP2pkhAddress(local_308);
  local_31c = cfd::core::Address::GetNetType((Address *)local_308);
  local_320 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff478,
             (char *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff468,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x184b3c);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xaf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x184b99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x184bf1);
  local_344 = cfd::core::Address::GetWitnessVersion((Address *)local_308);
  local_348 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff478,
             (char *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             (WitnessVersion *)in_stack_fffffffffffff468,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x184cb0);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message((Message *)0x184d0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x184d65);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x184d7f);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_380,kTestnet,local_398);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  cfd::AddressFactory::CreateP2wpkhAddress(local_510);
  local_524 = cfd::core::Address::GetNetType((Address *)local_510);
  local_528 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff478,
             (char *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff468,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x184f0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    testing::Message::~Message((Message *)0x184f67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x184fbf);
  local_54c = cfd::core::Address::GetWitnessVersion((Address *)local_510);
  local_550 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff478,
             (char *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             (WitnessVersion *)in_stack_fffffffffffff468,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_548);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x18507e);
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    testing::Message::~Message((Message *)0x1850db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x185133);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18514d);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_588,kRegtest,local_5a0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  cfd::AddressFactory::CreateP2pkhAddress(local_718);
  local_72c = cfd::core::Address::GetNetType((Address *)local_718);
  local_730 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff478,
             (char *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff468,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_728);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    in_stack_fffffffffffff478 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1852d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbb,in_stack_fffffffffffff478);
    testing::internal::AssertHelper::operator=(&local_740,&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    testing::Message::~Message((Message *)0x185335);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18538d);
  WVar5 = cfd::core::Address::GetWitnessVersion((Address *)local_718);
  local_758 = 0xffffffff;
  local_754 = WVar5;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff478,(char *)CONCAT44(WVar5,in_stack_fffffffffffff470),
             (WitnessVersion *)in_stack_fffffffffffff468,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_750);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff470);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x18544c);
    testing::internal::AssertHelper::AssertHelper
              (&local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_768,&local_760);
    testing::internal::AssertHelper::~AssertHelper(&local_768);
    testing::Message::~Message((Message *)0x1854a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x185501);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff467,
                      CONCAT16(in_stack_fffffffffffff466,
                               CONCAT15(in_stack_fffffffffffff465,
                                        CONCAT14(in_stack_fffffffffffff464,in_stack_fffffffffffff460
                                                )))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18551b);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_790,kLiquidV1,local_7a8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(WVar5,uVar7));
  testing::internal::ConstCharPtr::ConstCharPtr(&local_7b0,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_7b0);
  if ((bool)uVar2) {
    local_7b1 = 0;
    in_stack_fffffffffffff466 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff466) {
      cfd::AddressFactory::CreateP2pkhAddress(local_930);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff466,
                                         CONCAT15(in_stack_fffffffffffff465,
                                                  CONCAT14(in_stack_fffffffffffff464,
                                                           in_stack_fffffffffffff460)))));
    }
    if ((local_7b1 & 1) == 0) {
      local_7b0.value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001856e3;
    }
  }
  else {
LAB_001856e3:
    testing::Message::Message(local_940);
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xc2,local_7b0.value);
    testing::internal::AssertHelper::operator=(&local_948,local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    testing::Message::~Message((Message *)0x18574b);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1857a3);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_970,kElementsRegtest,local_988);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(WVar5,uVar7));
  testing::internal::ConstCharPtr::ConstCharPtr(&local_990,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_990);
  if ((bool)uVar3) {
    local_991 = 0;
    uVar4 = testing::internal::AlwaysTrue();
    if ((bool)uVar4) {
      cfd::AddressFactory::CreateP2pkhAddress(local_b10);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff466,
                                         CONCAT15(uVar3,CONCAT14(uVar4,in_stack_fffffffffffff460))))
                );
    }
    if ((local_991 & 1) != 0) goto LAB_00185a01;
    local_990.value =
         "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_b20);
  testing::internal::AssertHelper::AssertHelper
            (&local_b28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xc6,local_990.value);
  testing::internal::AssertHelper::operator=(&local_b28,local_b20);
  testing::internal::AssertHelper::~AssertHelper(&local_b28);
  testing::Message::~Message((Message *)0x1859b9);
LAB_00185a01:
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x185a0e);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x185a1b);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    AddressFactory factory(NetType::kLiquidV1, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}